

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor.cpp
# Opt level: O3

void __thiscall despot::Floor::AddCell(Floor *this,Coord coord)

{
  pointer *ppCVar1;
  iterator __position;
  Coord local_8;
  
  __position._M_current =
       (this->cells_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
       super__Vector_impl_data._M_finish;
  this->floor_[(long)coord >> 0x20][coord.x] =
       (int)((ulong)((long)__position._M_current -
                    (long)(this->cells_).
                          super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3);
  if (__position._M_current ==
      (this->cells_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = coord;
    std::vector<despot::Coord,std::allocator<despot::Coord>>::
    _M_realloc_insert<despot::Coord_const&>
              ((vector<despot::Coord,std::allocator<despot::Coord>> *)&this->cells_,__position,
               &local_8);
  }
  else {
    *__position._M_current = coord;
    ppCVar1 = &(this->cells_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  return;
}

Assistant:

void Floor::AddCell(Coord coord) {
	floor_[coord.y][coord.x] = cells_.size();
	cells_.push_back(coord);
}